

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::TimezoneFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  bool bVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *func;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::ScalarFunction,_true> *__range1;
  ScalarFunction function;
  ScalarFunctionSet *operator_set;
  allocator_type *in_stack_fffffffffffffb88;
  ScalarFunction *function_00;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb90;
  ScalarFunction *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffbac;
  LogicalType *in_stack_fffffffffffffbb0;
  ScalarFunction *this_00;
  undefined1 **local_410;
  bind_scalar_function_extended_t in_stack_fffffffffffffcb0;
  bind_scalar_function_t in_stack_fffffffffffffcb8;
  scalar_function_t *in_stack_fffffffffffffcc0;
  LogicalType *in_stack_fffffffffffffcc8;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  in_stack_fffffffffffffcd0;
  ScalarFunction *in_stack_fffffffffffffcd8;
  function_statistics_t in_stack_fffffffffffffd10;
  init_local_state_t in_stack_fffffffffffffd18;
  LogicalType *in_stack_fffffffffffffd20;
  FunctionStability in_stack_fffffffffffffd28;
  FunctionNullHandling in_stack_fffffffffffffd30;
  bind_lambda_function_t in_stack_fffffffffffffd38;
  undefined1 *local_190 [6];
  undefined8 *local_160;
  undefined8 local_158;
  byte local_9;
  
  local_9 = 0;
  GetDatePartFunction<duckdb::DatePart::TimezoneOperator>();
  LogicalType::LogicalType
            (in_stack_fffffffffffffbb0,(LogicalTypeId)((uint)in_stack_fffffffffffffbac >> 0x18));
  LogicalType::LogicalType
            (in_stack_fffffffffffffbb0,(LogicalTypeId)((uint)in_stack_fffffffffffffbac >> 0x18));
  local_160 = local_190;
  local_158 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x1ec8052);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffba0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb98;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffba4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb90,iVar1,in_stack_fffffffffffffb88);
  LogicalType::LogicalType
            (in_stack_fffffffffffffbb0,(LogicalTypeId)((uint)in_stack_fffffffffffffbac >> 0x18));
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
            );
  LogicalType::LogicalType
            (in_stack_fffffffffffffbb0,(LogicalTypeId)((uint)in_stack_fffffffffffffbac >> 0x18));
  this_00 = (ScalarFunction *)0x0;
  uVar3 = 0;
  this = (ScalarFunction *)0x0;
  function_00 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffcd8,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffcd0._M_current,
             in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             in_stack_fffffffffffffcb0,in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd20,in_stack_fffffffffffffd28,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd38);
  LogicalType::~LogicalType((LogicalType *)0x1ec811f);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x1ec812c);
  LogicalType::~LogicalType((LogicalType *)0x1ec8139);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1ec8146);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x1ec8153);
  local_410 = (undefined1 **)&local_160;
  do {
    local_410 = local_410 + -3;
    LogicalType::~LogicalType((LogicalType *)0x1ec817c);
  } while (local_410 != local_190);
  ScalarFunction::ScalarFunction
            (this_00,(ScalarFunction *)CONCAT44(in_stack_fffffffffffffbac,uVar3));
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function_00);
  ScalarFunction::~ScalarFunction(this);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)function_00)
  ;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)function_00)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                        *)this,(__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                                *)function_00);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator*((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                 *)&stack0xfffffffffffffcd0);
    BaseScalarFunction::SetReturnsError(&function_00->super_BaseScalarFunction);
    BaseScalarFunction::~BaseScalarFunction(&this->super_BaseScalarFunction);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                  *)&stack0xfffffffffffffcd0);
  }
  local_9 = 1;
  ScalarFunction::~ScalarFunction(this);
  if ((local_9 & 1) == 0) {
    ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0x1ec8412);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet TimezoneFun::GetFunctions() {
	auto operator_set = GetDatePartFunction<DatePart::TimezoneOperator>();

	//	PG also defines timezone(INTERVAL, TIME_TZ) => TIME_TZ
	ScalarFunction function({LogicalType::INTERVAL, LogicalType::TIME_TZ}, LogicalType::TIME_TZ,
	                        DatePart::TimezoneOperator::BinaryFunction<interval_t, dtime_tz_t, dtime_tz_t>);

	operator_set.AddFunction(function);

	for (auto &func : operator_set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}

	return operator_set;
}